

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anandan.c
# Opt level: O0

void laplacian(qnode_ptr_t p)

{
  long lVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  byte bVar4;
  undefined8 auStack_1038 [257];
  qnode_ptr_t local_830;
  undefined8 local_828 [257];
  int local_20;
  int local_1c;
  int j;
  int i;
  qnode_ptr_t q;
  qnode_ptr_t p_local;
  
  bVar4 = 0;
  q = p;
  _j = create_node(0,p->res,p->sizx,p->sizy);
  alloc_lap(_j);
  _j->gauss_ptr = q->lap_ptr;
  for (local_1c = 0; local_1c < _j->sizy; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < _j->sizx; local_20 = local_20 + 1) {
      if ((local_1c % 2 == 0) || (local_20 % 2 == 0)) {
        (*_j->gauss_ptr)[_j->res * local_1c + local_20] = 0.0;
      }
    }
  }
  local_830 = _j;
  memcpy(local_828,&kerb,0x808);
  puVar2 = local_828;
  puVar3 = auStack_1038;
  for (lVar1 = 0x101; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
  }
  convolve(local_830);
  q->lap_ptr = _j->lap_ptr;
  dealloc_gauss(_j);
  free(_j);
  for (local_1c = 0; local_1c < q->sizy; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < q->sizx; local_20 = local_20 + 1) {
      (*q->lap_ptr)[q->res * local_1c + local_20] =
           (*q->gauss_ptr)[q->res * local_1c + local_20] -
           (*q->lap_ptr)[q->res * local_1c + local_20];
    }
  }
  return;
}

Assistant:

void laplacian(p)
qnode_ptr_t p ;

{ extern kernel_t kerb ;
  qnode_ptr_t create_node(), q ;
  int i, j ;

  q = create_node(0,p->res,p->sizx,p->sizy) ;
  alloc_lap(q) ;
  q->gauss_ptr = p->lap_ptr ;
  for (i = 0 ; i < q->sizy ; i++) {
    for (j = 0 ; j < q->sizx ; j++) {
      if ((i%2 == 0) || (j%2 == 0)) {
        (*q->gauss_ptr)[q->res*i + j] = 0.0 ;
      }
    }
  }
  convolve(q,kerb) ;
  p->lap_ptr = q->lap_ptr ;
  dealloc_gauss(q) ;
  free(q) ;
  for (i = 0 ; i < p->sizy ; i++) {
    for (j = 0 ; j < p->sizx ; j++) {
      (*p->lap_ptr)[p->res*i + j] =
      (*p->gauss_ptr)[p->res*i + j] - (*p->lap_ptr)[p->res*i + j] ;
    }
  }
}